

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O2

Abc_Ntk_t * Io_ReadNetlist(char *pFileName,Io_FileType_t FileType,int fCheck)

{
  Vec_Ptr_t *p;
  bool bVar1;
  bool bVar2;
  Io_FileType_t IVar3;
  int iVar4;
  FILE *pFVar5;
  Abc_Ntk_t *pAVar6;
  Abc_Ntk_t *pNtk;
  int iVar7;
  char *pcVar8;
  size_t sStack_30;
  
  if ((FileType == IO_FILE_UNKNOWN) || (FileType == IO_FILE_NONE)) {
    fprintf(_stdout,"Generic file reader requires a known file extension to open \"%s\".\n",
            pFileName);
    return (Abc_Ntk_t *)0x0;
  }
  pFVar5 = fopen(pFileName,"r");
  if (pFVar5 == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open input file \"%s\". ",pFileName);
    pcVar8 = Extra_FileGetSimilarName(pFileName,".blif",".bench",".pla",".baf",".aig");
    if (pcVar8 != (char *)0x0) {
      fprintf(_stdout,"Did you mean \"%s\"?",pcVar8);
    }
    fputc(10,_stdout);
    return (Abc_Ntk_t *)0x0;
  }
  fclose(pFVar5);
  if (FileType - IO_FILE_AIGER < 3) {
    if (FileType == IO_FILE_BAF) {
      pAVar6 = Io_ReadBaf(pFileName,fCheck);
    }
    else if (FileType == IO_FILE_AIGER) {
      pAVar6 = Io_ReadAiger(pFileName,fCheck);
    }
    else {
      pAVar6 = Io_ReadBblif(pFileName,fCheck);
    }
    if (pAVar6 != (Abc_Ntk_t *)0x0) {
      return pAVar6;
    }
    pcVar8 = "Reading AIG from file has failed.\n";
    sStack_30 = 0x22;
    pFVar5 = _stdout;
    goto LAB_002dfb00;
  }
  if (FileType == IO_FILE_BLIF) {
    iVar7 = 0;
LAB_002dfa4f:
    pAVar6 = Io_ReadBlifMv(pFileName,iVar7,fCheck);
  }
  else {
    IVar3 = Io_ReadFileType(pFileName);
    if (IVar3 == IO_FILE_BLIFMV) {
      iVar7 = 1;
      goto LAB_002dfa4f;
    }
    switch(FileType) {
    case IO_FILE_EDIF:
      pAVar6 = Io_ReadEdif(pFileName,fCheck);
      break;
    case IO_FILE_EQN:
      pAVar6 = Io_ReadEqn(pFileName,fCheck);
      break;
    case IO_FILE_GML:
    case IO_FILE_JSON:
    case IO_FILE_LIST:
    case IO_FILE_MOPLA:
    case IO_FILE_SMV:
switchD_002dfb31_caseD_c:
      pcVar8 = "Unknown file format.\n";
      sStack_30 = 0x15;
      pFVar5 = _stderr;
      goto LAB_002dfb00;
    case IO_FILE_PLA:
      pAVar6 = Io_ReadPla(pFileName,0,0,0,0,fCheck);
      break;
    case IO_FILE_VERILOG:
      pAVar6 = Io_ReadVerilog(pFileName,fCheck);
      break;
    default:
      if (FileType != IO_FILE_BENCH) goto switchD_002dfb31_caseD_c;
      pAVar6 = Io_ReadBench(pFileName,fCheck);
    }
  }
  if (pAVar6 != (Abc_Ntk_t *)0x0) {
    if (fCheck == 0) {
      return pAVar6;
    }
    if ((pAVar6->nObjCounts[10] == 0) && (pAVar6->nObjCounts[9] == 0)) {
      return pAVar6;
    }
    bVar1 = false;
    for (iVar7 = 0; p = pAVar6->pDesign->vModules, iVar7 < p->nSize; iVar7 = iVar7 + 1) {
      pNtk = (Abc_Ntk_t *)Vec_PtrEntry(p,iVar7);
      iVar4 = Abc_NtkIsAcyclicWithBoxes(pNtk);
      bVar2 = true;
      if (iVar4 != 0) {
        bVar2 = bVar1;
      }
      bVar1 = bVar2;
    }
    if (bVar1) {
      Abc_NtkDelete(pAVar6);
      return (Abc_Ntk_t *)0x0;
    }
    return pAVar6;
  }
  pcVar8 = "Reading network from file has failed.\n";
  sStack_30 = 0x26;
  pFVar5 = _stdout;
LAB_002dfb00:
  fwrite(pcVar8,sStack_30,1,pFVar5);
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Io_ReadNetlist( char * pFileName, Io_FileType_t FileType, int fCheck )
{
    FILE * pFile;
    Abc_Ntk_t * pNtk;
    if ( FileType == IO_FILE_NONE || FileType == IO_FILE_UNKNOWN )
    {
        fprintf( stdout, "Generic file reader requires a known file extension to open \"%s\".\n", pFileName );
        return NULL;
    }
    // check if the file exists
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".blif", ".bench", ".pla", ".baf", ".aig" )) )
            fprintf( stdout, "Did you mean \"%s\"?", pFileName );
        fprintf( stdout, "\n" );
       return NULL;
    }
    fclose( pFile );
    // read the AIG
    if ( FileType == IO_FILE_AIGER || FileType == IO_FILE_BAF || FileType == IO_FILE_BBLIF )
    {
        if ( FileType == IO_FILE_AIGER )
            pNtk = Io_ReadAiger( pFileName, fCheck );
        else if ( FileType == IO_FILE_BAF )
            pNtk = Io_ReadBaf( pFileName, fCheck );
        else // if ( FileType == IO_FILE_BBLIF )
            pNtk = Io_ReadBblif( pFileName, fCheck );
        if ( pNtk == NULL )
        {
            fprintf( stdout, "Reading AIG from file has failed.\n" );
            return NULL;
        }
        return pNtk;
    }
    // read the new netlist
    if ( FileType == IO_FILE_BLIF )
//        pNtk = Io_ReadBlif( pFileName, fCheck );
        pNtk = Io_ReadBlifMv( pFileName, 0, fCheck );
    else if ( Io_ReadFileType(pFileName) == IO_FILE_BLIFMV )
        pNtk = Io_ReadBlifMv( pFileName, 1, fCheck );
    else if ( FileType == IO_FILE_BENCH )
        pNtk = Io_ReadBench( pFileName, fCheck );
    else if ( FileType == IO_FILE_EDIF )
        pNtk = Io_ReadEdif( pFileName, fCheck );
    else if ( FileType == IO_FILE_EQN )
        pNtk = Io_ReadEqn( pFileName, fCheck );
    else if ( FileType == IO_FILE_PLA )
        pNtk = Io_ReadPla( pFileName, 0, 0, 0, 0, fCheck );
    else if ( FileType == IO_FILE_VERILOG )
        pNtk = Io_ReadVerilog( pFileName, fCheck );
    else 
    {
        fprintf( stderr, "Unknown file format.\n" );
        return NULL;
    }
    if ( pNtk == NULL )
    {
        fprintf( stdout, "Reading network from file has failed.\n" );
        return NULL;
    }
    if ( fCheck && (Abc_NtkBlackboxNum(pNtk) || Abc_NtkWhiteboxNum(pNtk)) )
    {
        int i, fCycle = 0;
        Abc_Ntk_t * pModel;
//        fprintf( stdout, "Warning: The network contains hierarchy.\n" );
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
                if ( !Abc_NtkIsAcyclicWithBoxes( pModel ) )
                    fCycle = 1;
        if ( fCycle )
        {
            Abc_NtkDelete( pNtk );
            return NULL;    
        }
    }
    return pNtk;
}